

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int max_background_threads_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  int iVar5;
  size_t in_RAX;
  size_t sVar6;
  mutex_prof_data_t *data;
  size_t oldval;
  size_t local_38;
  
  local_38 = in_RAX;
  duckdb_je_background_thread_ctl_init((tsdn_t *)tsd);
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  iVar5 = pthread_mutex_trylock
                    ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
    duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  sVar2 = duckdb_je_max_background_threads;
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    local_38 = duckdb_je_max_background_threads;
    iVar5 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(size_t *)oldp = duckdb_je_max_background_threads;
      }
      else {
        sVar6 = 8;
        if (uVar1 < 8) {
          sVar6 = uVar1;
        }
        switchD_015df945::default(oldp,&local_38,sVar6);
        *oldlenp = sVar6;
        iVar5 = 0x16;
      }
    }
  }
  else {
    iVar5 = 0x16;
    if (newlen == 8) {
      local_38 = duckdb_je_max_background_threads;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 != 8) {
          sVar6 = 8;
          if (uVar1 < 8) {
            sVar6 = uVar1;
          }
          switchD_015df945::default(oldp,&local_38,sVar6);
          *oldlenp = sVar6;
          goto LAB_01c3dcdb;
        }
        *(size_t *)oldp = duckdb_je_max_background_threads;
      }
      uVar1 = *newp;
      sVar3 = duckdb_je_max_background_threads;
      if (uVar1 != sVar2) {
        if (duckdb_je_opt_max_background_threads < uVar1) goto LAB_01c3dcdb;
        sVar3 = uVar1;
        if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
          duckdb_je_background_thread_enabled_state.repr = false;
          _Var4 = duckdb_je_background_threads_disable(tsd);
          iVar5 = 0xe;
          if (!_Var4) {
            duckdb_je_background_thread_enabled_state.repr = true;
            duckdb_je_max_background_threads = uVar1;
            _Var4 = duckdb_je_background_threads_enable(tsd);
            iVar5 = 0xe;
            if (!_Var4) {
              iVar5 = 0;
            }
          }
          goto LAB_01c3dcdb;
        }
      }
      duckdb_je_max_background_threads = sVar3;
      iVar5 = 0;
    }
  }
LAB_01c3dcdb:
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar5;
}

Assistant:

static int
max_background_threads_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	size_t oldval;

	if (!have_background_thread) {
		return ENOENT;
	}
	background_thread_ctl_init(tsd_tsdn(tsd));

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	if (newp == NULL) {
		oldval = max_background_threads;
		READ(oldval, size_t);
	} else {
		if (newlen != sizeof(size_t)) {
			ret = EINVAL;
			goto label_return;
		}
		oldval = max_background_threads;
		READ(oldval, size_t);

		size_t newval = *(size_t *)newp;
		if (newval == oldval) {
			ret = 0;
			goto label_return;
		}
		if (newval > opt_max_background_threads) {
			ret = EINVAL;
			goto label_return;
		}

		if (background_thread_enabled()) {
			background_thread_enabled_set(tsd_tsdn(tsd), false);
			if (background_threads_disable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
			max_background_threads = newval;
			background_thread_enabled_set(tsd_tsdn(tsd), true);
			if (background_threads_enable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
		} else {
			max_background_threads = newval;
		}
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}